

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O2

c_v256 * c_v256_wideshuffle_8(c_v256 a,c_v256 b,c_v256 pattern)

{
  int c;
  c_v256 *in_RDI;
  long lVar1;
  c_v256 *pcVar2;
  
  for (lVar1 = 0; lVar1 != 0x20; lVar1 = lVar1 + 1) {
    pcVar2 = &a;
    if (pattern.u8[lVar1] < 0x20) {
      pcVar2 = &b;
    }
    in_RDI->u8[lVar1] = pcVar2->u8[pattern.u8[lVar1] & 0x1f];
  }
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_wideshuffle_8(c_v256 a, c_v256 b, c_v256 pattern) {
  c_v256 t;
  int c;
  for (c = 0; c < 32; c++)
    t.u8[c] = (pattern.u8[c] < 32
                   ? b.u8
                   : a.u8)[CONFIG_BIG_ENDIAN ? 31 - (pattern.u8[c] & 31)
                                             : pattern.u8[c] & 31];
  return t;
}